

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child,int options)

{
  lys_module *plVar1;
  LYS_NODE LVar2;
  LYS_NODE LVar3;
  int iVar4;
  LY_STMT stmt;
  lys_node **pplVar5;
  char *pcVar6;
  char *pcVar7;
  void *pvVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  LY_VLOG_ELEM elem_type;
  LY_ECODE ecode;
  lys_node **pplVar11;
  ly_ctx *plVar12;
  bool bVar13;
  lyext_substmt *local_48;
  lyext_substmt *info;
  ly_ctx *local_38;
  
  local_38 = child->module->ctx;
  local_48 = (lyext_substmt *)0x0;
  info._4_4_ = options;
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31a,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
    if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31b,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
LAB_00156dba:
    plVar9 = (lys_node *)0x0;
switchD_00156e80_caseD_0:
    bVar13 = true;
    if ((child->nodetype & 0xb9bf) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      pcVar7 = "(sub)module";
LAB_00156e5b:
      ecode = LYE_INCHILDSTMT;
      elem_type = LY_VLOG_LYS;
      plVar12 = local_38;
      goto LAB_001570c0;
    }
    goto switchD_00156e80_caseD_3;
  }
  LVar3 = parent->nodetype;
  module = parent->module;
  plVar9 = parent;
  if (LVar3 == LYS_USES) {
    for (; plVar9 != (lys_node *)0x0; plVar9 = plVar9->parent) {
      LVar3 = plVar9->nodetype;
      if (LVar3 != LYS_USES) goto LAB_00156d19;
    }
    goto LAB_00156dba;
  }
LAB_00156d19:
  bVar13 = true;
  switch(LVar3) {
  case LYS_UNKNOWN:
    goto switchD_00156e80_caseD_0;
  case LYS_CONTAINER:
    break;
  case LYS_CHOICE:
    LVar3 = child->nodetype;
    if ((LVar3 & 0x807f) != LYS_UNKNOWN) {
      bVar13 = LVar3 == LYS_CASE;
      goto switchD_00156e80_caseD_3;
    }
    pcVar6 = strnodetype(LVar3);
    pcVar7 = "choice";
    goto LAB_00156e5b;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_00156e80_caseD_3;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_00156e80_caseD_4:
    pcVar7 = strnodetype(child->nodetype);
    pcVar6 = strnodetype(plVar9->nodetype);
    plVar12 = local_38;
    ly_vlog(local_38,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar9,pcVar7,pcVar6);
    pcVar7 = strnodetype(plVar9->nodetype);
    pcVar6 = "The \"%s\" statement cannot have any data substatement.";
    ecode = LYE_SPEC;
    elem_type = LY_VLOG_PREV;
    plVar9 = (lys_node *)0x0;
    goto LAB_001570c0;
  default:
    if (LVar3 == LYS_LIST) break;
    if (LVar3 == LYS_ANYXML) goto switchD_00156e80_caseD_4;
    if (LVar3 == LYS_CASE) {
      if ((child->nodetype & 0x903f) == LYS_UNKNOWN) {
        pcVar6 = strnodetype(child->nodetype);
        pcVar7 = "case";
        goto LAB_00156e5b;
      }
      goto switchD_00156e80_caseD_3;
    }
    if (LVar3 != LYS_NOTIF) {
      if (LVar3 == LYS_RPC) {
LAB_00157014:
        if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
          pcVar6 = strnodetype(child->nodetype);
          pcVar7 = "rpc";
          goto LAB_00156e5b;
        }
        goto switchD_00156e80_caseD_3;
      }
      if ((LVar3 == LYS_INPUT) || (LVar3 == LYS_OUTPUT)) goto LAB_00156fb2;
      if (LVar3 == LYS_EXT) {
        stmt = lys_snode2stmt(child->nodetype);
        pvVar8 = lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)plVar9,&local_48);
        if (pvVar8 == (void *)0x0) {
          pcVar6 = strnodetype(child->nodetype);
          pcVar7 = *(char **)plVar9->name;
          goto LAB_00156e5b;
        }
        goto switchD_00156e80_caseD_3;
      }
      if (LVar3 != LYS_AUGMENT) {
        if (LVar3 == LYS_ACTION) goto LAB_00157014;
        if (LVar3 == LYS_ANYDATA) goto switchD_00156e80_caseD_4;
        if (LVar3 == LYS_GROUPING) break;
        goto switchD_00156e80_caseD_3;
      }
      LVar3 = child->nodetype;
      LVar2 = LVar3 & 0xd0ff;
      goto joined_r0x00157096;
    }
LAB_00156fb2:
    LVar3 = child->nodetype;
    if ((LVar3 & 0x983f) != LYS_UNKNOWN) goto switchD_00156e80_caseD_3;
LAB_0015709c:
    pcVar6 = strnodetype(LVar3);
    pcVar7 = strnodetype(plVar9->nodetype);
    ecode = LYE_INCHILDSTMT;
    elem_type = LY_VLOG_LYS;
    plVar12 = local_38;
LAB_001570c0:
    ly_vlog(plVar12,ecode,elem_type,plVar9,pcVar6,pcVar7);
    goto LAB_001570c7;
  }
  LVar3 = child->nodetype;
  LVar2 = LVar3 & 0xd8bf;
joined_r0x00157096:
  if (LVar2 == LYS_UNKNOWN) goto LAB_0015709c;
switchD_00156e80_caseD_3:
  if ((((module->ctx->models).flags & 2) == 0) &&
     (iVar4 = lys_check_id(child,parent,module), iVar4 != 0)) {
LAB_001570c7:
    iVar4 = 1;
  }
  else {
    if (child->parent != (lys_node *)0x0) {
      lys_node_unlink(child);
    }
    LVar3 = child->nodetype;
    if (((LVar3 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) || (parent->nodetype == LYS_EXT)) {
      if (bVar13) {
        if (parent == (lys_node *)0x0) {
          plVar9 = module->data;
          if (plVar9 == (lys_node *)0x0) {
            module->data = child;
          }
          else {
            plVar10 = plVar9->prev;
            plVar10->next = child;
            child->prev = plVar10;
            plVar9->prev = child;
          }
          parent = (lys_node *)0x0;
          plVar9 = parent;
          goto LAB_0015713f;
        }
      }
      else {
        plVar9 = (lys_node *)calloc(1,0x70);
        if (plVar9 == (lys_node *)0x0) {
          ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_addchild");
          return 1;
        }
        pcVar7 = lydict_insert(module->ctx,child->name,0);
        plVar9->name = pcVar7;
        plVar9->flags = 0x40;
        if ((info._4_4_ & 3) == 0) {
          plVar9->flags = parent->flags & 3 | 0x40;
        }
        plVar9->module = module;
        plVar9->nodetype = LYS_CASE;
        plVar9->prev = plVar9;
        lys_node_addchild(parent,module,plVar9,info._4_4_);
        LVar3 = child->nodetype;
        parent = plVar9;
      }
      pplVar5 = lys_child(parent,LVar3);
      if (pplVar5 == (lys_node **)0x0) {
        __assert_fail("pchild",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x3ba,
                      "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                     );
      }
      child->parent = parent;
      if (*pplVar5 == (lys_node *)0x0) {
        *pplVar5 = child;
        plVar9 = child;
      }
      else {
        plVar9 = (*pplVar5)->prev;
        plVar9->next = child;
        child->prev = plVar9;
      }
      while (plVar10 = plVar9->next, plVar10 != (lys_node *)0x0) {
        plVar10->parent = parent;
        plVar9 = plVar10;
      }
      (*pplVar5)->prev = plVar9;
      plVar9 = parent;
    }
    else {
      pplVar5 = &parent->child;
      pplVar11 = pplVar5;
      while( true ) {
        plVar9 = *pplVar11;
        if (plVar9 == (lys_node *)0x0) {
          __assert_fail("iter",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                        ,0x385,
                        "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                       );
        }
        if (plVar9->nodetype == LVar3) break;
        pplVar11 = &plVar9->next;
      }
      if (*pplVar5 == plVar9) {
        *pplVar5 = child;
        plVar10 = plVar9->prev;
      }
      else {
        plVar10 = plVar9->prev;
        plVar10->next = child;
      }
      child->prev = plVar10;
      plVar10 = plVar9->next;
      child->next = plVar10;
      if (plVar10 == (lys_node *)0x0) {
        plVar10 = *pplVar5;
      }
      plVar10->prev = child;
      child->parent = parent;
      plVar9->next = (lys_node *)0x0;
      plVar9->prev = plVar9;
      plVar9->parent = (lys_node *)0x0;
      lys_node_free(plVar9,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
      plVar9 = parent;
    }
LAB_0015713f:
    for (; plVar12 = local_38, parent != (lys_node *)0x0; parent = parent->parent) {
      if ((parent->nodetype & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING)) != LYS_UNKNOWN) goto LAB_00157186;
    }
    plVar10 = child;
    if (plVar9 != (lys_node *)0x0) {
      for (; plVar10 != (lys_node *)0x0; plVar10 = plVar10->parent) {
        if ((plVar10->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
        goto LAB_00157186;
      }
      if (((plVar9->flags & 2) != 0) && ((child->flags & 1) != 0)) {
        ly_vlog(local_38,LYE_INARG,LY_VLOG_LYS,child,"true","config");
        ly_vlog(plVar12,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "State nodes cannot have configuration nodes as children.");
        goto LAB_001570c7;
      }
    }
LAB_00157186:
    LVar3 = child->nodetype;
    if (((LVar3 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
         LYS_UNKNOWN) && ((child->flags & 0x80) != 0)) {
      for (; plVar9 != (lys_node *)0x0; plVar9 = lys_parent(plVar9)) {
        if ((plVar9->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
          if ((char)plVar9->flags < '\0') break;
          plVar9->flags = plVar9->flags | 0x80;
        }
      }
    }
    iVar4 = 0;
    if (((LVar3 & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) && (child->child == (lys_node *)0x0)) {
      plVar9 = (lys_node *)calloc(1,0x78);
      plVar10 = (lys_node *)calloc(1,0x78);
      if (plVar9 == (lys_node *)0x0 || plVar10 == (lys_node *)0x0) {
        iVar4 = 1;
        ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_addchild");
        free(plVar9);
        free(plVar10);
      }
      else {
        plVar9->nodetype = LYS_INPUT;
        pcVar7 = lydict_insert(child->module->ctx,"input",5);
        plVar9->name = pcVar7;
        plVar10->nodetype = LYS_OUTPUT;
        pcVar7 = lydict_insert(child->module->ctx,"output",6);
        plVar10->name = pcVar7;
        plVar1 = child->module;
        plVar10->module = plVar1;
        plVar9->module = plVar1;
        plVar10->parent = child;
        plVar9->parent = child;
        plVar10->flags = 0x40;
        plVar9->flags = 0x40;
        plVar9->next = plVar10;
        plVar9->prev = plVar10;
        plVar10->prev = plVar9;
        child->child = plVar9;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child, int options)
{
    struct ly_ctx *ctx = child->module->ctx;
    struct lys_node *iter, **pchild, *log_parent;
    struct lys_node_inout *in, *out;
    struct lys_node_case *c;
    struct lys_node_augment *aug;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
        log_parent = parent;

        if (type == LYS_USES) {
            /* we are adding children to uses -> we must be copying grouping contents into it, so properly check the parent */
            while (log_parent && (log_parent->nodetype == LYS_USES)) {
                if (log_parent->nodetype == LYS_AUGMENT) {
                    aug = (struct lys_node_augment *)log_parent;
                    if (!aug->target) {
                        /* unresolved augment, just pass the node type check */
                        goto skip_nodetype_check;
                    }
                    log_parent = aug->target;
                } else {
                    log_parent = log_parent->parent;
                }
            }
            if (log_parent) {
                type = log_parent->nodetype;
            } else {
                type = 0;
            }
        }
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
        log_parent = NULL;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(log_parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)log_parent, &info);
        if (!p) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)log_parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

skip_nodetype_check:
    /* check identifier uniqueness */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* find the implicit input/output node */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->nodetype == child->nodetype) {
                break;
            }
        }
        assert(iter);

        /* switch the old implicit node (iter) with the new one (child) */
        if (parent->child == iter) {
            /* first child */
            parent->child = child;
        } else {
            iter->prev->next = child;
        }
        child->prev = iter->prev;
        child->next = iter->next;
        if (iter->next) {
            iter->next->prev = child;
        } else {
            /* last child */
            parent->child->prev = child;
        }
        child->parent = parent;

        /* isolate the node and free it */
        iter->next = NULL;
        iter->prev = iter;
        iter->parent = NULL;
        lys_node_free(iter, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            LY_CHECK_ERR_RETURN(!c, LOGMEM(ctx), EXIT_FAILURE);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            if (!(options & (LYS_PARSE_OPT_CFG_IGNORE | LYS_PARSE_OPT_CFG_NOINHERIT))) {
                /* get config flag from parent */
                c->flags |= parent->flags & LYS_CONFIG_MASK;
            }
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c, options);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            child->parent = parent;
            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                iter = child;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            (*pchild)->prev = iter;
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if ((child->nodetype & (LYS_RPC | LYS_ACTION)) && !child->child) {
        in = calloc(1, sizeof *in);
        out = calloc(1, sizeof *out);
        if (!in || !out) {
            LOGMEM(ctx);
            free(in);
            free(out);
            return EXIT_FAILURE;
        }
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out->nodetype = LYS_OUTPUT;
        out->name = lydict_insert(child->module->ctx, "output", 6);
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}